

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::erase
          (QGenericArrayOps<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *this,
          pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *b,qsizetype n)

{
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *ppVar1;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *pQVar2;
  long in_RDX;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_RSI;
  long in_RDI;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *end;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *e;
  pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *in_stack_ffffffffffffffb8;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *in_stack_ffffffffffffffc0
  ;
  QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *local_20;
  
  local_20 = (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             (in_RSI + in_RDX);
  ppVar1 = QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::begin
                     ((QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
                      0x2f6783);
  if ((in_RSI == ppVar1) &&
     (in_stack_ffffffffffffffc0 = local_20,
     pQVar2 = (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
              QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end(local_20)
     , in_stack_ffffffffffffffc0 != pQVar2)) {
    *(QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> **)(in_RDI + 8) =
         local_20;
  }
  else {
    pQVar2 = (QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_> *)
             QArrayDataPointer<std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>_>::end
                       (in_stack_ffffffffffffffc0);
    for (; local_20 != pQVar2; local_20 = local_20 + 1) {
      std::pair<QHttpNetworkRequest,_QHttpNetworkReply_*>::operator=
                ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)in_stack_ffffffffffffffc0,
                 in_stack_ffffffffffffffb8);
    }
  }
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 0x10) - in_RDX;
  std::destroy<std::pair<QHttpNetworkRequest,QHttpNetworkReply*>*>
            ((pair<QHttpNetworkRequest,_QHttpNetworkReply_*> *)in_stack_ffffffffffffffc0,
             in_stack_ffffffffffffffb8);
  return;
}

Assistant:

void erase(T *b, qsizetype n)
    {
        T *e = b + n;
        Q_ASSERT(this->isMutable());
        Q_ASSERT(b < e);
        Q_ASSERT(b >= this->begin() && b < this->end());
        Q_ASSERT(e > this->begin() && e <= this->end());

        // Comply with std::vector::erase(): erased elements and all after them
        // are invalidated. However, erasing from the beginning effectively
        // means that all iterators are invalidated. We can use this freedom to
        // erase by moving towards the end.
        if (b == this->begin() && e != this->end()) {
            this->ptr = e;
        } else {
            const T *const end = this->end();

            // move (by assignment) the elements from e to end
            // onto b to the new end
            while (e != end) {
                *b = std::move(*e);
                ++b;
                ++e;
            }
        }
        this->size -= n;
        std::destroy(b, e);
    }